

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

bool __thiscall ObjectBlockPool<64,_1024>::IsBasePointer(ObjectBlockPool<64,_1024> *this,void *ptr)

{
  MyLargeBlock *local_28;
  MyLargeBlock *curr;
  void *ptr_local;
  ObjectBlockPool<64,_1024> *this_local;
  
  local_28 = this->activePages;
  while( true ) {
    if (local_28 == (MyLargeBlock *)0x0) {
      return false;
    }
    if (((local_28->page <= ptr) && (ptr <= &local_28->next)) &&
       (((int)ptr - ((int)local_28 + 8) & 0x3fU) == 8)) break;
    local_28 = local_28->next;
  }
  return true;
}

Assistant:

bool IsBasePointer(void* ptr)
	{
		MyLargeBlock *curr = activePages;
		while(curr)
		{
			if((char*)ptr >= (char*)curr->page && (char*)ptr <= (char*)curr->page + sizeof(curr->page))
			{
				if(((unsigned int)(intptr_t)((char*)ptr - (char*)curr->page) & (elemSize - 1)) == sizeof(markerType))
					return true;
			}
			curr = curr->next;
		}
		return false;
	}